

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O0

void __thiscall wasm::DeNaN::visitFunction(DeNaN *this,Function *func)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  uint uVar1;
  bool bVar2;
  Module *pMVar3;
  Call *pCVar4;
  Block *pBVar5;
  PassOptions *pPVar6;
  allocator<char> local_311;
  string local_310;
  PassOptions local_2f0;
  undefined1 local_248 [8];
  PassRunner runner;
  allocator<wasm::Expression_*> local_121;
  Type local_120;
  LocalGet *local_118;
  LocalGet **local_110;
  size_type local_108;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_100;
  size_t local_e8;
  char *pcStack_e0;
  LocalSet *local_d8;
  BasicType local_cc;
  Type local_c8;
  Type local_c0;
  allocator<wasm::Expression_*> local_b1;
  Type local_b0;
  LocalGet *local_a8;
  LocalGet **local_a0;
  size_type local_98;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  size_t local_78;
  char *pcStack_70;
  LocalSet *local_68;
  BasicType local_5c;
  Type local_58;
  uint local_50;
  Index i;
  ulong local_40;
  size_t num;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> fixes;
  Builder builder;
  Function *func_local;
  DeNaN *this_local;
  
  bVar2 = Importable::imported(&func->super_Importable);
  if (!bVar2) {
    pMVar3 = Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>::getModule
                       ((Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_> *)
                        &(this->
                         super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
                         ).
                         super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
                       );
    Builder::Builder((Builder *)
                     &fixes.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pMVar3);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
    local_40 = Function::getNumParams(func);
    for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
      local_58 = Function::getLocalType(func,local_50);
      local_5c = f32;
      bVar2 = wasm::Type::operator==(&local_58,&local_5c);
      uVar1 = local_50;
      if (bVar2) {
        local_78 = (this->deNan32).super_IString.str._M_len;
        pcStack_70 = (this->deNan32).super_IString.str._M_str;
        wasm::Type::Type(&local_b0,f32);
        local_a8 = Builder::makeLocalGet
                             ((Builder *)
                              &fixes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,local_b0);
        local_a0 = &local_a8;
        local_98 = 1;
        std::allocator<wasm::Expression_*>::allocator(&local_b1);
        __l_00._M_len = local_98;
        __l_00._M_array = (iterator)local_a0;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  (&local_90,__l_00,&local_b1);
        wasm::Type::Type(&local_c0,f32);
        target_00.super_IString.str._M_str = pcStack_70;
        target_00.super_IString.str._M_len = local_78;
        pCVar4 = Builder::makeCall((Builder *)
                                   &fixes.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,target_00,
                                   &local_90,local_c0,false);
        local_68 = Builder::makeLocalSet
                             ((Builder *)
                              &fixes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                              (Expression *)pCVar4);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,
                   (value_type *)&local_68);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_90);
        std::allocator<wasm::Expression_*>::~allocator(&local_b1);
      }
      else {
        local_c8 = Function::getLocalType(func,local_50);
        local_cc = f64;
        bVar2 = wasm::Type::operator==(&local_c8,&local_cc);
        uVar1 = local_50;
        if (bVar2) {
          local_e8 = (this->deNan64).super_IString.str._M_len;
          pcStack_e0 = (this->deNan64).super_IString.str._M_str;
          wasm::Type::Type(&local_120,f64);
          local_118 = Builder::makeLocalGet
                                ((Builder *)
                                 &fixes.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,local_120
                                );
          local_110 = &local_118;
          local_108 = 1;
          std::allocator<wasm::Expression_*>::allocator(&local_121);
          __l._M_len = local_108;
          __l._M_array = (iterator)local_110;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    (&local_100,__l,&local_121);
          wasm::Type::Type((Type *)&runner.skippedPasses._M_h._M_single_bucket,f64);
          target.super_IString.str._M_str = pcStack_e0;
          target.super_IString.str._M_len = local_e8;
          pCVar4 = Builder::makeCall((Builder *)
                                     &fixes.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,target,
                                     &local_100,(Type)runner.skippedPasses._M_h._M_single_bucket,
                                     false);
          local_d8 = Builder::makeLocalSet
                               ((Builder *)
                                &fixes.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                                (Expression *)pCVar4);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,
                     (value_type *)&local_d8);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_100);
          std::allocator<wasm::Expression_*>::~allocator(&local_121);
        }
      }
    }
    bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
    if (!bVar2) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,&func->body
                );
      pBVar5 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         ((Builder *)
                          &fixes.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
      func->body = (Expression *)pBVar5;
      pMVar3 = Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>::getModule
                         ((Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_> *
                          )&(this->
                            super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
                            ).
                            super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
                         );
      pPVar6 = Pass::getPassOptions((Pass *)this);
      PassOptions::PassOptions(&local_2f0,pPVar6);
      PassRunner::PassRunner((PassRunner *)local_248,pMVar3,&local_2f0);
      PassOptions::~PassOptions(&local_2f0);
      PassRunner::setIsNested((PassRunner *)local_248,true);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"merge-blocks",&local_311);
      PassRunner::add((PassRunner *)local_248,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
      PassRunner::run((PassRunner *)local_248);
      PassRunner::~PassRunner((PassRunner *)local_248);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    // Instrument all locals as they enter the function.
    Builder builder(*getModule());
    std::vector<Expression*> fixes;
    auto num = func->getNumParams();
    for (Index i = 0; i < num; i++) {
      if (func->getLocalType(i) == Type::f32) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan32, {builder.makeLocalGet(i, Type::f32)}, Type::f32)));
      } else if (func->getLocalType(i) == Type::f64) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan64, {builder.makeLocalGet(i, Type::f64)}, Type::f64)));
      }
    }
    if (!fixes.empty()) {
      fixes.push_back(func->body);
      func->body = builder.makeBlock(fixes);
      // Merge blocks so we don't add an unnecessary one.
      PassRunner runner(getModule(), getPassOptions());
      runner.setIsNested(true);
      runner.add("merge-blocks");
      runner.run();
    }
  }